

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffectGlow.cpp
# Opt level: O3

SharedPtr<FontEffect> __thiscall
Rml::FontEffectGlowInstancer::InstanceFontEffect
          (FontEffectGlowInstancer *this,String *param_1,PropertyDictionary *properties)

{
  Colour<unsigned_char,_255,_false> _width_blur;
  Colour<unsigned_char,_255,_false> _width_outline;
  Colourb _colour;
  FontEffectGlow *pFVar1;
  bool bVar2;
  Property *pPVar3;
  PropertyDictionary *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  FontEffectGlowInstancer *pFVar5;
  SharedPtr<FontEffect> SVar6;
  undefined1 local_59;
  undefined8 local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_50 [2];
  FontEffectGlowInstancer *local_40;
  ulong local_38;
  
  local_40 = this;
  pPVar3 = PropertyDictionary::GetProperty(in_RCX,param_1[4].field_2._M_local_buf[0]);
  local_58._0_1_ = '\0';
  local_58._1_1_ = '\0';
  local_58._2_1_ = '\0';
  local_58._3_1_ = '\0';
  Variant::GetInto<int,_0>(&pPVar3->value,(int *)&local_58);
  _width_outline = local_58._0_4_;
  pPVar3 = PropertyDictionary::GetProperty(in_RCX,param_1[4].field_2._M_local_buf[1]);
  local_58._0_1_ = '\0';
  local_58._1_1_ = '\0';
  local_58._2_1_ = '\0';
  local_58._3_1_ = '\0';
  Variant::GetInto<int,_0>(&pPVar3->value,(int *)&local_58);
  _width_blur = local_58._0_4_;
  pPVar3 = PropertyDictionary::GetProperty(in_RCX,param_1[4].field_2._M_local_buf[2]);
  local_58 = (FontEffectGlow *)((ulong)local_58._4_4_ << 0x20);
  Variant::GetInto<int,_0>(&pPVar3->value,(int *)&local_58);
  local_38 = (ulong)local_58 & 0xffffffff;
  pPVar3 = PropertyDictionary::GetProperty(in_RCX,param_1[4].field_2._M_local_buf[3]);
  local_58 = (FontEffectGlow *)((ulong)local_58 & 0xffffffff00000000);
  Variant::GetInto<int,_0>(&pPVar3->value,(int *)&local_58);
  pFVar1 = local_58;
  pPVar3 = PropertyDictionary::GetProperty(in_RCX,param_1[4].field_2._M_local_buf[4]);
  local_58 = (FontEffectGlow *)CONCAT44(local_58._4_4_,0xff000000);
  Variant::GetInto<Rml::Colour<unsigned_char,_255,_false>,_0>
            (&pPVar3->value,(Colour<unsigned_char,_255,_false> *)&local_58);
  _colour = local_58._0_4_;
  if ((int)_width_blur < 0) {
    _width_blur = _width_outline;
  }
  local_58 = (FontEffectGlow *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Rml::FontEffectGlow,std::allocator<Rml::FontEffectGlow>>
            (a_Stack_50,(FontEffectGlow **)&local_58,(allocator<Rml::FontEffectGlow> *)&local_59);
  bVar2 = FontEffectGlow::Initialise
                    (local_58,(int)_width_outline,(int)_width_blur,
                     (Vector2i)(((long)pFVar1 << 0x20) + local_38));
  pFVar5 = local_40;
  if (bVar2) {
    FontEffect::SetColour(&local_58->super_FontEffect,_colour);
    (local_40->super_FontEffectInstancer)._vptr_FontEffectInstancer = (_func_int **)local_58;
    (local_40->super_FontEffectInstancer).properties.properties.
    super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)a_Stack_50[0]._M_pi;
    _Var4._M_pi = extraout_RDX_00;
    pFVar5 = local_40;
  }
  else {
    (local_40->super_FontEffectInstancer)._vptr_FontEffectInstancer = (_func_int **)0x0;
    (local_40->super_FontEffectInstancer).properties.properties.
    super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    _Var4._M_pi = extraout_RDX;
    if (a_Stack_50[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_50[0]._M_pi);
      _Var4._M_pi = extraout_RDX_01;
    }
  }
  SVar6.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  SVar6.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pFVar5;
  return (SharedPtr<FontEffect>)
         SVar6.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<FontEffect> FontEffectGlowInstancer::InstanceFontEffect(const String& /*name*/, const PropertyDictionary& properties)
{
	Vector2i offset;
	int width_outline = properties.GetProperty(id_width_outline)->Get<int>();
	int width_blur = properties.GetProperty(id_width_blur)->Get<int>();
	offset.x = properties.GetProperty(id_offset_x)->Get<int>();
	offset.y = properties.GetProperty(id_offset_y)->Get<int>();
	Colourb color = properties.GetProperty(id_color)->Get<Colourb>();

	if (width_blur < 0)
		width_blur = width_outline;

	auto font_effect = MakeShared<FontEffectGlow>();
	if (font_effect->Initialise(width_outline, width_blur, offset))
	{
		font_effect->SetColour(color);
		return font_effect;
	}

	return nullptr;
}